

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::~TCPSocket(TCPSocket *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  Timer *this_00;
  _Manager_type p_Var3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  bool bVar7;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_0011da28;
  (this->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_0011da60;
  p_Var5 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = p_Var5->_M_use_count;
    do {
      if (iVar4 == 0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = p_Var5->_M_use_count;
      bVar7 = iVar4 == iVar2;
      if (bVar7) {
        p_Var5->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar7);
  }
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar7 = true;
  }
  else {
    bVar7 = p_Var5->_M_use_count == 0;
  }
  this_00 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(this_00 == (Timer *)0x0 | bVar7)) {
    util::Timer::cancel(this_00);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  close(this->fd);
  p_Var3 = (this->sendTimeoutCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->sendTimeoutCallback_,(_Any_data *)&this->sendTimeoutCallback_,
              __destroy_functor);
  }
  p_Var3 = (this->recvTimeoutCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->recvTimeoutCallback_,(_Any_data *)&this->recvTimeoutCallback_,
              __destroy_functor);
  }
  p_Var5 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->closures).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  any::_destroy(&this->ud);
  p_Var3 = (this->recvCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->recvCallback_,(_Any_data *)&this->recvCallback_,__destroy_functor)
    ;
  }
  p_Var3 = (this->highWaterCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->highWaterCallback_,(_Any_data *)&this->highWaterCallback_,
              __destroy_functor);
  }
  p_Var3 = (this->closeCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->closeCallback_,(_Any_data *)&this->closeCallback_,
              __destroy_functor);
  }
  p_Var3 = (this->errorCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->errorCallback_,(_Any_data *)&this->errorCallback_,
              __destroy_functor);
  }
  p_Var3 = (this->flushCallback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->flushCallback_,(_Any_data *)&this->flushCallback_,
              __destroy_functor);
  }
  lVar6 = 0;
  do {
    linklist::~linklist((linklist *)((long)&this->sendLists[1].head + lVar6));
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != -0x20);
  std::__cxx11::
  _List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
  _M_clear(&(this->recvList).
            super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
          );
  p_Var5 = (this->super_enable_shared_from_this<hwnet::TCPSocket>)._M_weak_this.
           super___weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

TCPSocket::~TCPSocket() {
	if(auto sp = this->timer.lock()) {
		sp->cancel();
	}
	::close(this->fd);

#ifdef USE_SSL
	if(this->ssl) {
		SSL_free(this->ssl);
	}
#endif

}